

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_gost_err.c
# Opt level: O2

void ERR_unload_GOST_strings(void)

{
  if (error_loaded == '\x01') {
    ERR_unload_strings(lib_code,(ERR_STRING_DATA *)GOST_str_reasons);
    error_loaded = '\0';
  }
  return;
}

Assistant:

void ERR_unload_GOST_strings(void)
{
    if (error_loaded) {
#ifndef OPENSSL_NO_ERR
# ifndef OPENSSL_ERR_NEW_WORLD_ORDER
        ERR_unload_strings(lib_code, GOST_str_functs);
# endif
        ERR_unload_strings(lib_code, GOST_str_reasons);
#endif
        error_loaded = 0;
    }
}